

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

int backtrack_bad(saucy *s)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int oldLev;
  int tmp;
  int old;
  int min;
  saucy *s_local;
  
  iVar1 = s->lev;
  tmp = backtrack_loop(s);
  uVar2 = s->lev;
  do {
    iVar3 = backtrackBysatCounterExamples(s,&s->right);
    if (iVar3 != 0) {
      if ((s->fPrintTree != 0) && (s->lev < (int)uVar2)) {
        printf("Backtrack by SAT from level %d to %d\n",(ulong)uVar2,(ulong)(uint)s->lev);
      }
      iVar3 = s->nsplits;
      s->nsplits = s->splitlev[iVar1];
      rewind_coloring(s,&s->left,s->lev + 1);
      s->nsplits = iVar3;
      return tmp;
    }
    tmp = backtrack_loop(s);
  } while (s->lev != 0);
  if (s->fPrintTree != 0) {
    printf("Backtrack by SAT from level %d to %d\n",(ulong)uVar2,0);
  }
  return -1;
}

Assistant:

static int
backtrack_bad(struct saucy *s)
{
    int min, old, tmp;
    old = s->lev;
    min = backtrack_loop(s);
    if (BACKTRACK_BY_SAT) {
        int oldLev = s->lev;
        while (!backtrackBysatCounterExamples(s, &s->right)) {                          
            min = backtrack_loop(s);            
            if (!s->lev) {
                if (s->fPrintTree)
                    printf("Backtrack by SAT from level %d to %d\n", oldLev, 0);
                return -1;
            }
        }
        if (s->fPrintTree)          
            if (s->lev < oldLev) 
                printf("Backtrack by SAT from level %d to %d\n", oldLev, s->lev);
    }
    tmp = s->nsplits;
    s->nsplits = s->splitlev[old];
    rewind_coloring(s, &s->left, s->lev+1); 
    s->nsplits = tmp;
    if (SELECT_DYNAMICALLY)
        rewind_simulation_vectors(s, s->lev+1);

    return min;
}